

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_45cbbf::QPDFWordTokenFinder::check(QPDFWordTokenFinder *this)

{
  InputSource *input;
  bool bVar1;
  int iVar2;
  token_type_e tVar3;
  long lVar4;
  undefined4 extraout_var;
  string *__lhs;
  undefined4 extraout_var_00;
  bool local_102;
  char local_101;
  bool next_okay;
  qpdf_offset_t qStack_100;
  char next;
  qpdf_offset_t token_start;
  undefined8 local_f0;
  qpdf_offset_t pos;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  Tokenizer tokenizer;
  QPDFWordTokenFinder *this_local;
  
  tokenizer._144_8_ = this;
  ::qpdf::Tokenizer::Tokenizer((Tokenizer *)local_b0);
  input = this->is;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"finder",&local_d1);
  lVar4 = std::__cxx11::string::size();
  ::qpdf::Tokenizer::nextToken((Tokenizer *)local_b0,input,&local_d0,lVar4 + 2);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  iVar2 = (*this->is->_vptr_InputSource[4])();
  local_f0 = CONCAT44(extraout_var,iVar2);
  tVar3 = ::qpdf::Tokenizer::getType((Tokenizer *)local_b0);
  if (tVar3 == tt_word) {
    __lhs = ::qpdf::Tokenizer::getValue_abi_cxx11_((Tokenizer *)local_b0);
    bVar1 = std::operator!=(__lhs,&this->str);
    if (!bVar1) {
      qStack_100 = InputSource::getLastOffset(this->is);
      iVar2 = (*this->is->_vptr_InputSource[7])(this->is,&local_101,1);
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        QTC::TC("qpdf","QPDFTokenizer inline image at EOF",0);
        local_102 = true;
      }
      else {
        local_102 = is_delimiter(local_101);
      }
      (*this->is->_vptr_InputSource[5])(this->is,local_f0,0);
      if (local_102 == false) {
        this_local._7_1_ = false;
      }
      else if (qStack_100 == 0) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
      goto LAB_00302df9;
    }
  }
  QTC::TC("qpdf","QPDFTokenizer finder found wrong word",0);
  this_local._7_1_ = false;
LAB_00302df9:
  token_start._4_4_ = 1;
  ::qpdf::Tokenizer::~Tokenizer((Tokenizer *)local_b0);
  return this_local._7_1_;
}

Assistant:

bool
QPDFWordTokenFinder::check()
{
    // Find a word token matching the given string, preceded by a delimiter, and followed by a
    // delimiter or EOF.
    Tokenizer tokenizer;
    tokenizer.nextToken(is, "finder", str.size() + 2);
    qpdf_offset_t pos = is.tell();
    if (tokenizer.getType() != tt::tt_word || tokenizer.getValue() != str) {
        QTC::TC("qpdf", "QPDFTokenizer finder found wrong word");
        return false;
    }
    qpdf_offset_t token_start = is.getLastOffset();
    char next;
    bool next_okay = false;
    if (is.read(&next, 1) == 0) {
        QTC::TC("qpdf", "QPDFTokenizer inline image at EOF");
        next_okay = true;
    } else {
        next_okay = is_delimiter(next);
    }
    is.seek(pos, SEEK_SET);
    if (!next_okay) {
        return false;
    }
    if (token_start == 0) {
        // Can't actually happen...we never start the search at the beginning of the input.
        return false;
    }
    return true;
}